

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void error_report(string *message)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar1 = std::operator<<(poVar1,"ERROR!\t");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  error_count = error_count + 1;
  return;
}

Assistant:

void error_report(std::string message)
{
	std::cerr << std::endl << "ERROR!\t" << message << std::endl;
	error_count++;
}